

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O3

string * __thiscall
pbrt::SPPMIntegrator::ToString_abi_cxx11_(string *__return_storage_ptr__,SPPMIntegrator *this)

{
  RGBColorSpace *args_5;
  
  args_5 = this->colorSpace;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  detail::
  stringPrintfRecursive<pbrt::CameraHandle_const&,float_const&,int_const&,int_const&,int_const&,bool_const&,pbrt::RGBColorSpace_const&>
            (__return_storage_ptr__,
             "[ SPPMIntegrator camera: %s initialSearchRadius: %f nIterations: %d maxDepth: %d photonsPerIteration: %d regularize: %s colorSpace: %s digitPermutations:(elided) ]"
             ,&this->camera,&this->initialSearchRadius,&this->nIterations,&this->maxDepth,
             &this->photonsPerIteration,&this->regularize,args_5);
  return __return_storage_ptr__;
}

Assistant:

std::string SPPMIntegrator::ToString() const {
    return StringPrintf("[ SPPMIntegrator camera: %s initialSearchRadius: %f "
                        "nIterations: %d maxDepth: %d photonsPerIteration: %d "
                        "regularize: %s colorSpace: %s digitPermutations:(elided) ]",
                        camera, initialSearchRadius, nIterations, maxDepth,
                        photonsPerIteration, regularize, *colorSpace);
}